

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_error(LexState *ls,LexToken tok,ErrMsg em,...)

{
  char in_AL;
  uint *puVar1;
  int in_ESI;
  long in_RDI;
  __va_list_tag *in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  char *in_XMM2_Qb;
  GCstr *in_XMM3_Qa;
  lua_State *in_XMM3_Qb;
  va_list argp;
  char *tokstr;
  char *p;
  undefined4 in_stack_fffffffffffffed8;
  MSize in_stack_fffffffffffffedc;
  SBuf *in_stack_fffffffffffffee0;
  __va_list_tag *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  GCstr *in_stack_ffffffffffffff38;
  lua_State *in_stack_ffffffffffffff40;
  undefined8 local_8;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff20 = in_XMM1_Qb;
    in_stack_ffffffffffffff28 = in_XMM2_Qa;
    in_stack_ffffffffffffff30 = in_XMM2_Qb;
    in_stack_ffffffffffffff38 = in_XMM3_Qa;
    in_stack_ffffffffffffff40 = in_XMM3_Qb;
  }
  if (in_ESI != 0) {
    if (((in_ESI == 0x11f) || (in_ESI == 0x120)) || (in_ESI == 0x11e)) {
      puVar1 = (uint *)(in_RDI + 0x3c);
      if (*(uint *)(in_RDI + 0x40) == *puVar1) {
        local_8 = lj_buf_more2(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      else {
        local_8 = (char *)(ulong)*puVar1;
      }
      *local_8 = '\0';
      *puVar1 = (int)local_8 + 1;
    }
    else {
      lj_lex_token2str((LexState *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0);
    }
  }
  lj_err_lex(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             (BCLine)((ulong)in_stack_ffffffffffffff28 >> 0x20),(ErrMsg)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
}

Assistant:

void lj_lex_error(LexState *ls, LexToken tok, ErrMsg em, ...)
{
  const char *tokstr;
  va_list argp;
  if (tok == 0) {
    tokstr = NULL;
  } else if (tok == TK_name || tok == TK_string || tok == TK_number) {
    lex_save(ls, '\0');
    tokstr = sbufB(&ls->sb);
  } else {
    tokstr = lj_lex_token2str(ls, tok);
  }
  va_start(argp, em);
  lj_err_lex(ls->L, ls->chunkname, tokstr, ls->linenumber, em, argp);
  va_end(argp);
}